

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::HttpInputStream::Request> * __thiscall
kj::_::NullableValue<kj::HttpInputStream::Request>::operator=
          (NullableValue<kj::HttpInputStream::Request> *this,
          NullableValue<kj::HttpInputStream::Request> *other)

{
  undefined8 uVar1;
  char *pcVar2;
  HttpHeaders *pHVar3;
  AsyncInputStream *pAVar4;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<kj::AsyncInputStream>::dispose(&(this->field_1).value.body);
    }
    if (other->isSet == true) {
      uVar1 = *(undefined8 *)&other->field_1;
      pcVar2 = (other->field_1).value.url.content.ptr;
      pHVar3 = (other->field_1).value.headers;
      (this->field_1).value.url.content.size_ = (other->field_1).value.url.content.size_;
      (this->field_1).value.headers = pHVar3;
      *(undefined8 *)&this->field_1 = uVar1;
      (this->field_1).value.url.content.ptr = pcVar2;
      pAVar4 = (other->field_1).value.body.ptr;
      (this->field_1).value.body.disposer = (other->field_1).value.body.disposer;
      (this->field_1).value.body.ptr = pAVar4;
      (other->field_1).value.body.ptr = (AsyncInputStream *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }